

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

void xmlTextReaderCharacters(void *ctx,xmlChar *ch,int len)

{
  code *UNRECOVERED_JUMPTABLE;
  
  if ((*(long *)((long)ctx + 0x1a8) != 0) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)ctx + 0x1a8) + 0x58),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)();
    return;
  }
  return;
}

Assistant:

static void
xmlTextReaderCharacters(void *ctx, const xmlChar *ch, int len)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlTextReaderPtr reader = ctxt->_private;

#ifdef DEBUG_CALLBACKS
    printf("xmlTextReaderCharacters()\n");
#endif
    if ((reader != NULL) && (reader->characters != NULL)) {
	reader->characters(ctx, ch, len);
    }
}